

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void detail::AddUtilityCommand
               (cmLocalGenerator *lg,cmCommandOrigin origin,cmTarget *target,
               unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc)

{
  pointer pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  cmListFileBacktrace *pcVar2;
  char *pcVar3;
  string *psVar4;
  cmSourceFile *pcVar5;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_b0;
  cmSourceFile *local_a8;
  cmSourceFile *rule;
  undefined1 local_80 [8];
  string output;
  undefined1 local_50 [8];
  cmListFileBacktrace lfbt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc_local;
  cmTarget *target_local;
  cmCommandOrigin origin_local;
  cmLocalGenerator *lg_local;
  
  pcVar1 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  __x = cmCustomCommand::GetByproducts_abi_cxx11_(pcVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount,__x);
  pcVar1 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  pcVar2 = cmCustomCommand::GetBacktrace(pcVar1);
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_50,pcVar2);
  pcVar1 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  pcVar3 = cmCustomCommand::GetComment(pcVar1);
  if (pcVar3 == (char *)0x0) {
    pcVar1 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc)
    ;
    cmCustomCommand::SetComment(pcVar1,"");
  }
  psVar4 = cmTarget::GetName_abi_cxx11_(target);
  (*(lg->super_cmOutputConverter)._vptr_cmOutputConverter[0xe])
            (local_80,lg,psVar4,
             &lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,local_50);
  pcVar1 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  std::__cxx11::string::string((string *)&rule,(string *)local_80);
  cmCustomCommand::SetOutputs(pcVar1,(string *)&rule);
  std::__cxx11::string::~string((string *)&rule);
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr(&local_b0,cc);
  pcVar5 = anon_unknown.dwarf_409df2::AddCustomCommand(lg,origin,&local_b0,false);
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_b0);
  local_a8 = pcVar5;
  if (pcVar5 != (cmSourceFile *)0x0) {
    cmLocalGenerator::AddTargetByproducts
              (lg,target,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount,(cmListFileBacktrace *)local_50,origin);
  }
  cmTarget::AddSource(target,(string *)local_80,false);
  std::__cxx11::string::~string((string *)local_80);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  return;
}

Assistant:

void AddUtilityCommand(cmLocalGenerator& lg, cmCommandOrigin origin,
                       cmTarget* target, std::unique_ptr<cmCustomCommand> cc)
{
  // They might be moved away
  auto byproducts = cc->GetByproducts();
  auto lfbt = cc->GetBacktrace();

  // Use an empty comment to avoid generation of default comment.
  if (!cc->GetComment()) {
    cc->SetComment("");
  }

  // Create the generated symbolic output name of the utility target.
  std::string output =
    lg.CreateUtilityOutput(target->GetName(), byproducts, lfbt);
  cc->SetOutputs(output);

  cmSourceFile* rule = AddCustomCommand(lg, origin, std::move(cc),
                                        /*replace=*/false);
  if (rule) {
    lg.AddTargetByproducts(target, byproducts, lfbt, origin);
  }

  target->AddSource(output);
}